

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int readbits(int bitwidth,readblock_crap *crap)

{
  byte *pbVar1;
  int b;
  int val;
  readblock_crap *crap_local;
  int bitwidth_local;
  uint local_4;
  
  val = 0;
  b = 0;
  bitwidth_local = bitwidth;
  if (crap->sourcepos < crap->sourceend) {
    while (crap->rembits < bitwidth_local) {
      pbVar1 = crap->sourcepos;
      crap->sourcepos = pbVar1 + 1;
      val = (uint)*pbVar1 << ((byte)b & 0x1f) | val;
      if (crap->sourceend <= crap->sourcepos) {
        return val;
      }
      b = crap->rembits + b;
      bitwidth_local = bitwidth_local - crap->rembits;
      crap->rembits = 8;
    }
    local_4 = ((uint)*crap->sourcepos & (1 << ((byte)bitwidth_local & 0x1f)) - 1U) <<
              ((byte)b & 0x1f) | val;
    *crap->sourcepos = (byte)((int)(uint)*crap->sourcepos >> ((byte)bitwidth_local & 0x1f));
    crap->rembits = crap->rembits - bitwidth_local;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int readbits(int bitwidth, readblock_crap * crap)
{
	int val = 0;
	int b = 0;

	if (crap->sourcepos >= crap->sourceend) return val;

	while (bitwidth > crap->rembits) {
		val |= *crap->sourcepos++ << b;
		if (crap->sourcepos >= crap->sourceend) return val;
		b += crap->rembits;
		bitwidth -= crap->rembits;
		crap->rembits = 8;
	}

	val |= (*crap->sourcepos & ((1 << bitwidth) - 1)) << b;
	*crap->sourcepos >>= bitwidth;
	crap->rembits -= bitwidth;

	return val;
}